

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

ImageOperandsMask __thiscall
anon_unknown.dwarf_d6fcf8::TGlslangToSpvTraverser::TranslateImageOperands
          (TGlslangToSpvTraverser *this,CoherentFlags *coherentFlags)

{
  ushort uVar1;
  ImageOperandsMask IVar2;
  ImageOperandsMask IVar3;
  
  IVar3 = ImageOperandsMaskNone;
  if (this->glslangIntermediate->useVulkanMemoryModel == true) {
    uVar1 = *(ushort *)coherentFlags;
    IVar3 = ImageOperandsMakeTexelVisibleKHRMask|ImageOperandsMakeTexelAvailableKHRMask;
    if ((uVar1 & 0xbf) == 0) {
      IVar3 = uVar1 & (ImageOperandsMinLodMask|ConstOffsets|ImageOperandsOffsetMask|ConstOffset|Grad
                       |ImageOperandsLodMask|Bias);
    }
    IVar2 = (uint)uVar1 << 4;
    IVar3 = IVar2 & ImageOperandsVolatileTexelKHRMask |
            IVar2 & ImageOperandsNonPrivateTexelKHRMask | IVar3;
    if (((uVar1 >> 8 & 1) == 0) || ((this->builder).spvVersion < 0x10600)) {
      if (IVar3 == ImageOperandsMaskNone) {
        return ImageOperandsMaskNone;
      }
    }
    else {
      IVar3 = IVar3 | ImageOperandsNontemporalMask;
    }
    spv::Builder::addCapability(&this->builder,CapabilityVulkanMemoryModel);
  }
  return IVar3;
}

Assistant:

spv::ImageOperandsMask TGlslangToSpvTraverser::TranslateImageOperands(
    const spv::Builder::AccessChain::CoherentFlags &coherentFlags)
{
    spv::ImageOperandsMask mask = spv::ImageOperandsMaskNone;

    if (!glslangIntermediate->usingVulkanMemoryModel())
        return mask;

    if (coherentFlags.volatil ||
        coherentFlags.anyCoherent()) {
        mask = mask | spv::ImageOperandsMakeTexelAvailableKHRMask |
                      spv::ImageOperandsMakeTexelVisibleKHRMask;
    }
    if (coherentFlags.nonprivate) {
        mask = mask | spv::ImageOperandsNonPrivateTexelKHRMask;
    }
    if (coherentFlags.volatil) {
        mask = mask | spv::ImageOperandsVolatileTexelKHRMask;
    }
    if (coherentFlags.nontemporal && builder.getSpvVersion() >= spv::Spv_1_6) {
        mask = mask | spv::ImageOperandsNontemporalMask;
    }
    if (mask != spv::ImageOperandsMaskNone) {
        builder.addCapability(spv::CapabilityVulkanMemoryModelKHR);
    }

    return mask;
}